

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
::find_or_prepare_insert_non_soo<google::protobuf::Descriptor*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
          *this,Descriptor **key)

{
  char *pcVar1;
  long lVar2;
  ushort uVar3;
  undefined1 uVar4;
  bool bVar5;
  uint32_t uVar6;
  uint uVar7;
  uintptr_t v;
  size_t i;
  PolicyFunctions *in_R9;
  ushort uVar8;
  ulong uVar9;
  CommonFields *common;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i match;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar14 [16];
  iterator iVar30;
  FindInfo target;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_70;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  uVar9 = ((ulong)*key ^ 0x443af8) * -0x234dd359734ecb13;
  uVar9 = ((uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38) ^ (ulong)*key) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38);
  probe(&local_70,(CommonFields *)this,(size_t)common);
  lVar2 = *(long *)(this + 0x10);
  uVar4 = (undefined1)(uVar9 >> 0x38);
  auVar11 = ZEXT216(CONCAT11(uVar4,uVar4) & 0x7f7f);
  auVar11 = pshuflw(auVar11,auVar11,0);
  uVar10 = auVar11._0_4_;
  auVar11._4_4_ = uVar10;
  auVar11._0_4_ = uVar10;
  auVar11._8_4_ = uVar10;
  auVar11._12_4_ = uVar10;
  do {
    pcVar1 = (char *)(lVar2 + local_70.offset_);
    auVar12[0] = -(auVar11[0] == *pcVar1);
    auVar12[1] = -(auVar11[1] == pcVar1[1]);
    auVar12[2] = -(auVar11[2] == pcVar1[2]);
    auVar12[3] = -(auVar11[3] == pcVar1[3]);
    auVar12[4] = -(auVar11[4] == pcVar1[4]);
    auVar12[5] = -(auVar11[5] == pcVar1[5]);
    auVar12[6] = -(auVar11[6] == pcVar1[6]);
    auVar12[7] = -(auVar11[7] == pcVar1[7]);
    auVar12[8] = -(auVar11[8] == pcVar1[8]);
    auVar12[9] = -(auVar11[9] == pcVar1[9]);
    auVar12[10] = -(auVar11[10] == pcVar1[10]);
    auVar12[0xb] = -(auVar11[0xb] == pcVar1[0xb]);
    auVar12[0xc] = -(auVar11[0xc] == pcVar1[0xc]);
    auVar12[0xd] = -(auVar11[0xd] == pcVar1[0xd]);
    auVar12[0xe] = -(auVar11[0xe] == pcVar1[0xe]);
    auVar12[0xf] = -(auVar11[0xf] == pcVar1[0xf]);
    cVar13 = *pcVar1;
    cVar15 = pcVar1[1];
    cVar16 = pcVar1[2];
    cVar17 = pcVar1[3];
    cVar18 = pcVar1[4];
    cVar19 = pcVar1[5];
    cVar20 = pcVar1[6];
    cVar21 = pcVar1[7];
    cVar22 = pcVar1[8];
    cVar23 = pcVar1[9];
    cVar24 = pcVar1[10];
    cVar25 = pcVar1[0xb];
    cVar26 = pcVar1[0xc];
    cVar27 = pcVar1[0xd];
    cVar28 = pcVar1[0xe];
    cVar29 = pcVar1[0xf];
    for (uVar8 = (ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
        ; uVar8 != 0; uVar8 = uVar8 - 1 & uVar8) {
      local_58 = cVar13;
      cStack_57 = cVar15;
      cStack_56 = cVar16;
      cStack_55 = cVar17;
      cStack_54 = cVar18;
      cStack_53 = cVar19;
      cStack_52 = cVar20;
      cStack_51 = cVar21;
      cStack_50 = cVar22;
      cStack_4f = cVar23;
      cStack_4e = cVar24;
      cStack_4d = cVar25;
      cStack_4c = cVar26;
      cStack_4b = cVar27;
      cStack_4a = cVar28;
      cStack_49 = cVar29;
      local_48 = auVar11;
      uVar6 = TrailingZeros<unsigned_short>(uVar8);
      i = uVar6 + local_70.offset_ & local_70.mask_;
      if (*(Descriptor **)(*(long *)(this + 0x18) + i * 0x20) == *key) {
        bVar5 = false;
        goto LAB_0016aaf3;
      }
      auVar11 = local_48;
      cVar13 = local_58;
      cVar15 = cStack_57;
      cVar16 = cStack_56;
      cVar17 = cStack_55;
      cVar18 = cStack_54;
      cVar19 = cStack_53;
      cVar20 = cStack_52;
      cVar21 = cStack_51;
      cVar22 = cStack_50;
      cVar23 = cStack_4f;
      cVar24 = cStack_4e;
      cVar25 = cStack_4d;
      cVar26 = cStack_4c;
      cVar27 = cStack_4b;
      cVar28 = cStack_4a;
      cVar29 = cStack_49;
    }
    auVar14[0] = -(cVar13 == -0x80);
    auVar14[1] = -(cVar15 == -0x80);
    auVar14[2] = -(cVar16 == -0x80);
    auVar14[3] = -(cVar17 == -0x80);
    auVar14[4] = -(cVar18 == -0x80);
    auVar14[5] = -(cVar19 == -0x80);
    auVar14[6] = -(cVar20 == -0x80);
    auVar14[7] = -(cVar21 == -0x80);
    auVar14[8] = -(cVar22 == -0x80);
    auVar14[9] = -(cVar23 == -0x80);
    auVar14[10] = -(cVar24 == -0x80);
    auVar14[0xb] = -(cVar25 == -0x80);
    auVar14[0xc] = -(cVar26 == -0x80);
    auVar14[0xd] = -(cVar27 == -0x80);
    auVar14[0xe] = -(cVar28 == -0x80);
    auVar14[0xf] = -(cVar29 == -0x80);
    uVar8 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf;
    if (uVar8 != 0) {
      bVar5 = ShouldInsertBackwardsForDebug
                        (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar5) {
        uVar3 = 0xf;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar7 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar7 = TrailingZeros<unsigned_short>(uVar8);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_70.index_;
      i = PrepareInsertNonSoo((container_internal *)this,common,
                              uVar7 + local_70.offset_ & local_70.mask_,target,in_R9);
      bVar5 = true;
LAB_0016aaf3:
      iVar30 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                              *)this,i);
      __return_storage_ptr__->first = iVar30;
      __return_storage_ptr__->second = bVar5;
      return __return_storage_ptr__;
    }
    uVar9 = local_70.index_ + 0x10;
    local_70.offset_ = local_70.offset_ + local_70.index_ + 0x10 & local_70.mask_;
    local_70.index_ = uVar9;
    if (*(ulong *)this < uVar9) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>, K = google::protobuf::Descriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }